

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::EnumOptions::MergePartialFromCodedStream
          (EnumOptions *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  UnknownFieldSet *unknown_fields;
  UninterpretedOption *value;
  bool *value_00;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar8 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = (uint)bVar2, (~(uint)*pbVar1 & uVar8) < 0x80)
           ) goto LAB_00301cb3;
        uVar8 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar9 = (ulong)uVar8 | 0x100000000;
    }
    else {
LAB_00301cb3:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar8 = (uint)uVar9;
    if ((uVar9 & 0x100000000) == 0) {
LAB_00301bf0:
      if (uVar8 == 0) {
        return true;
      }
      if ((uVar8 & 7) == 4) {
        return true;
      }
      unknown_fields = mutable_unknown_fields(this);
      if (uVar8 < 8000) {
        bVar4 = internal::WireFormat::SkipField(input,uVar8,unknown_fields);
      }
      else {
        bVar4 = internal::ExtensionSet::ParseField
                          (&this->_extensions_,uVar8,input,
                           (Message *)&_EnumOptions_default_instance_,unknown_fields);
      }
    }
    else {
      uVar5 = (uint)(uVar9 >> 3) & 0x1fffffff;
      cVar7 = (char)uVar9;
      if (uVar5 != 999) {
        if (uVar5 == 3) {
          if (cVar7 == '\x18') {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
            value_00 = &this->deprecated_;
            goto LAB_00301c83;
          }
        }
        else if ((uVar5 == 2) && (cVar7 == '\x10')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          value_00 = &this->allow_alias_;
LAB_00301c83:
          bVar4 = internal::WireFormatLite::
                  ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,value_00);
          goto LAB_00301ca9;
        }
        goto LAB_00301bf0;
      }
      if (cVar7 != ':') goto LAB_00301bf0;
      value = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                        (&this->uninterpreted_option_);
      bVar4 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                        (input,value);
    }
LAB_00301ca9:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool EnumOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.EnumOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool allow_alias = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_allow_alias();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &allow_alias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.EnumOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.EnumOptions)
  return false;
#undef DO_
}